

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Node::Node(Node *this,CompiledModule *module)

{
  Reader declId;
  Which WVar1;
  uint uVar2;
  uint32_t uVar3;
  Reader *__return_storage_ptr__;
  uint64_t uVar4;
  size_t sVar5;
  Impl *this_00;
  size_t in_RCX;
  ArrayPtr<const_char> AVar6;
  StringPtr declName;
  ArrayPtr<const_char> local_148;
  undefined1 local_138 [8];
  Reader name;
  Reader local_f8;
  Reader local_c8;
  Reader local_98;
  ArrayPtr<const_char> local_68;
  char *local_58;
  char *pcStack_50;
  Reader local_48;
  CompiledModule *local_18;
  CompiledModule *module_local;
  Node *this_local;
  
  local_18 = module;
  module_local = (CompiledModule *)this;
  NodeTranslator::Resolver::Resolver(&this->super_Resolver);
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_003a4e00;
  this->module = local_18;
  kj::Maybe<capnp::compiler::Compiler::Node_&>::Maybe(&this->parent,(void *)0x0);
  __return_storage_ptr__ = &this->declaration;
  CompiledModule::getParsedFile(&local_48,local_18);
  ParsedFile::Reader::getRoot(__return_storage_ptr__,&local_48);
  Declaration::Reader::getName(&local_98,__return_storage_ptr__);
  local_68 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_98);
  local_58 = local_68.ptr;
  pcStack_50 = (char *)local_68.size_;
  Declaration::Reader::getId(&local_c8,__return_storage_ptr__);
  declId._reader.capTable = local_c8._reader.capTable;
  declId._reader.segment = local_c8._reader.segment;
  declId._reader.data = local_c8._reader.data;
  declId._reader.pointers = local_c8._reader.pointers;
  declId._reader.dataSize = local_c8._reader.dataSize;
  declId._reader.pointerCount = local_c8._reader.pointerCount;
  declId._reader._38_2_ = local_c8._reader._38_2_;
  declId._reader.nestingLimit = local_c8._reader.nestingLimit;
  declId._reader._44_4_ = local_c8._reader._44_4_;
  declName.content.size_ = in_RCX;
  declName.content.ptr = pcStack_50;
  uVar4 = generateId((Node *)0x0,(uint64_t)local_58,declName,declId);
  this->id = uVar4;
  AVar6 = (ArrayPtr<const_char>)CompiledModule::getSourceName(local_18);
  (this->displayName).content = AVar6;
  WVar1 = Declaration::Reader::which(__return_storage_ptr__);
  this->kind = WVar1;
  Declaration::Reader::getParameters(&local_f8,__return_storage_ptr__);
  uVar2 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                    (&local_f8);
  this->genericParamCount = uVar2;
  this->isBuiltin = false;
  Content::Content(&this->guardedContent);
  this->inGetContent = false;
  kj::Maybe<capnp::schema::Node::Reader>::Maybe(&this->loadedFinalSchema);
  Declaration::Reader::getName((Reader *)local_138,&this->declaration);
  local_148 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)local_138);
  sVar5 = kj::StringPtr::size((StringPtr *)&local_148);
  if (sVar5 == 0) {
    uVar3 = Declaration::Reader::getStartByte(&this->declaration);
    this->startByte = uVar3;
    uVar3 = Declaration::Reader::getEndByte(&this->declaration);
    this->endByte = uVar3;
  }
  else {
    uVar3 = LocatedText::Reader::getStartByte((Reader *)local_138);
    this->startByte = uVar3;
    uVar3 = LocatedText::Reader::getEndByte((Reader *)local_138);
    this->endByte = uVar3;
  }
  this_00 = CompiledModule::getCompiler(local_18);
  uVar4 = Compiler::Impl::addNode(this_00,this->id,this);
  this->id = uVar4;
  return;
}

Assistant:

Compiler::Node::Node(CompiledModule& module)
    : module(&module),
      parent(nullptr),
      declaration(module.getParsedFile().getRoot()),
      id(generateId(0, declaration.getName().getValue(), declaration.getId())),
      displayName(module.getSourceName()),
      kind(declaration.which()),
      genericParamCount(declaration.getParameters().size()),
      isBuiltin(false) {
  auto name = declaration.getName();
  if (name.getValue().size() > 0) {
    startByte = name.getStartByte();
    endByte = name.getEndByte();
  } else {
    startByte = declaration.getStartByte();
    endByte = declaration.getEndByte();
  }

  id = module.getCompiler().addNode(id, *this);
}